

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

bool __thiscall DynamicHistogram<double>::contains(DynamicHistogram<double> *this,double value)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  
  iVar2 = (*this->_vptr_DynamicHistogram[2])();
  if ((char)iVar2 != '\0') {
    bVar1 = contains_(this,value);
    return bVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::contains - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool
    contains(double const value)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::contains - Histogram could not be initialized.");
        return this->contains_(value);
    }